

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_declaration.h
# Opt level: O1

void __thiscall ncnn::Einsum_final::~Einsum_final(Einsum_final *this)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  
  p_Var2 = this->_vptr_Einsum_final[-3];
  p_Var1 = (_func_int *)((long)&this->_vptr_Einsum_final + (long)p_Var2);
  ((Layer *)(&this->field_0x8 + (long)p_Var2))->_vptr_Layer = (_func_int **)&PTR__Einsum_0062f538;
  if (*(long **)(&this->field_0xf0 + (long)p_Var2) != (long *)(&this->field_0x100 + (long)p_Var2)) {
    operator_delete(*(long **)(&this->field_0xf0 + (long)p_Var2),
                    *(long *)(&this->field_0x100 + (long)p_Var2) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(p_Var1 + 0xd8));
  Layer::~Layer((Layer *)(&this->field_0x8 + (long)p_Var2));
  operator_delete(p_Var1,0x110);
  return;
}

Assistant:

virtual int create_pipeline(const Option& opt) {
        { int ret = Einsum::create_pipeline(opt); if (ret) return ret; }
        return 0;
    }